

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall
ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test::
~ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test
          (ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test *this)

{
  ConfigurationTest_shouldThrowExceptionOnIncorrectFilename_Test *this_local;
  
  ConfigurationTest::~ConfigurationTest(&this->super_ConfigurationTest);
  return;
}

Assistant:

TEST_F(ConfigurationTest, shouldThrowExceptionOnIncorrectFilename) {
    EXPECT_ANY_THROW(aeron::archive::Configuration cfg("I tHinK this FileNAmE shOulD n0t exIst"));
}